

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O1

int opus_picture_tag_parse(OpusPictureTag *_pic,char *_tag)

{
  long *_buf;
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  uint *__dest;
  long lVar7;
  char *pcVar8;
  uchar *__ptr;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  opus_uint32 oVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  bool bVar17;
  opus_uint32 file_colors;
  opus_uint32 file_depth;
  opus_uint32 file_height;
  opus_uint32 file_width;
  uint local_80;
  opus_uint32 local_7c;
  uint local_78;
  int local_74;
  opus_uint32 local_70;
  opus_uint32 local_6c;
  opus_uint32 local_68;
  opus_uint32 local_64;
  ulong local_60;
  long local_58;
  char *local_50;
  ulong local_48;
  long local_40;
  OpusPictureTag *local_38;
  
  iVar3 = op_strncasecmp("METADATA_BLOCK_PICTURE",_tag,0x16);
  if (iVar3 == 0) {
    lVar7 = 0x17;
    if (_tag[0x16] != '=') {
      lVar7 = 0;
    }
  }
  else {
    lVar7 = 0;
  }
  pcVar16 = _tag + lVar7;
  sVar6 = strlen(pcVar16);
  if ((sVar6 & 3) != 0) {
    return -0x84;
  }
  if (sVar6 < 0x2c) {
    return -0x84;
  }
  uVar14 = ((sVar6 >> 2) * 3 - (ulong)(pcVar16[sVar6 - 1] == '=')) -
           (ulong)(pcVar16[sVar6 - 2] == '=');
  if (uVar14 < 0x20) {
    return -0x84;
  }
  __dest = (uint *)malloc(uVar14 + 1);
  if (__dest == (uint *)0x0) {
    return -0x81;
  }
  lVar7 = 0;
  uVar9 = 0;
  do {
    lVar15 = uVar9 * 3;
    uVar11 = 0;
    bVar17 = false;
    uVar10 = 0;
    do {
      bVar1 = pcVar16[uVar11];
      if (bVar1 == 0x2b) {
        uVar4 = 0x3e;
LAB_0010a2e7:
        uVar10 = uVar10 << 6 | uVar4;
        bVar2 = true;
      }
      else {
        if (bVar1 == 0x2f) {
          uVar4 = 0x3f;
          goto LAB_0010a2e7;
        }
        uVar13 = (uint)bVar1;
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar4 = uVar13 + 4;
          goto LAB_0010a2e7;
        }
        if ((byte)(bVar1 + 0x9f) < 0x1a) {
          uVar4 = uVar13 - 0x47;
          goto LAB_0010a2e7;
        }
        if ((byte)(bVar1 + 0xbf) < 0x1a) {
          uVar4 = uVar13 - 0x41;
          goto LAB_0010a2e7;
        }
        bVar2 = false;
        uVar4 = 0;
        if ((uVar13 == 0x3d) && (uVar14 < lVar7 + uVar11)) goto LAB_0010a2e7;
      }
      if (!bVar2) goto LAB_0010a348;
      bVar17 = 2 < uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar11 != 4);
    *(char *)((long)__dest + lVar15) = (char)(uVar10 >> 0x10);
    if (lVar15 + 1U < uVar14) {
      *(char *)((long)__dest + lVar15 + 1) = (char)(uVar10 >> 8);
      if (lVar15 + 2U < uVar14) {
        *(char *)((long)__dest + lVar15 + 2U) = (char)uVar10;
      }
    }
LAB_0010a348:
    iVar3 = -0x84;
    bVar2 = true;
    local_38 = _pic;
    if (!bVar17) {
      pcVar16 = (char *)0x0;
      goto LAB_0010a3bf;
    }
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 3;
    pcVar16 = pcVar16 + 4;
  } while (uVar9 != sVar6 >> 2);
  uVar10 = __dest[1];
  uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar9 = (ulong)uVar10;
  if (uVar14 - 0x20 < uVar9) {
    uVar10 = 0;
    local_80 = 0;
    local_78 = 0;
    local_7c = 0;
    oVar12 = 0;
    pcVar16 = (char *)0x0;
    __ptr = (uchar *)0x0;
    uVar13 = 0;
    uVar4 = 0;
    pcVar8 = (char *)0x0;
    goto LAB_0010a3c4;
  }
  uVar4 = *__dest;
  pcVar16 = (char *)malloc((ulong)(uVar10 + 1));
  if (pcVar16 == (char *)0x0) {
    uVar10 = 0;
    local_80 = 0;
    local_78 = 0;
    local_7c = 0;
    oVar12 = 0;
    __ptr = (uchar *)0x0;
    uVar13 = 0;
    uVar4 = 0;
    iVar3 = -0x81;
    pcVar16 = (char *)0x0;
    pcVar8 = (char *)0x0;
    goto LAB_0010a3c4;
  }
  memcpy(pcVar16,__dest + 2,uVar9);
  pcVar16[uVar9] = '\0';
  uVar10 = *(uint *)((long)__dest + uVar9 + 8);
  uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  uVar11 = (ulong)uVar10;
  local_48 = uVar9;
  if ((uVar14 - 0x20) - uVar9 < uVar11) {
    uVar10 = 0;
    local_80 = 0;
    local_78 = 0;
    local_7c = 0;
    oVar12 = 0;
    __ptr = (uchar *)0x0;
    uVar13 = 0;
    uVar4 = 0;
    pcVar8 = (char *)0x0;
    goto LAB_0010a3c4;
  }
  pcVar8 = (char *)malloc((ulong)(uVar10 + 1));
  if (pcVar8 == (char *)0x0) {
    iVar3 = -0x81;
LAB_0010a3bf:
    uVar13 = 0;
    oVar12 = 0;
    __ptr = (uchar *)0x0;
    local_7c = 0;
    local_78 = 0;
    local_80 = 0;
    uVar10 = 0;
    uVar4 = 0;
    pcVar8 = (char *)0x0;
    goto LAB_0010a3c4;
  }
  lVar7 = local_48 + 0xc;
  memcpy(pcVar8,(void *)((long)__dest + lVar7),uVar11);
  pcVar8[uVar11] = '\0';
  lVar7 = lVar7 + uVar11;
  uVar10 = *(uint *)((long)__dest + lVar7);
  uVar13 = *(uint *)((long)__dest + lVar7 + 4);
  uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18;
  local_80 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  uVar13 = *(uint *)((long)__dest + lVar7 + 8);
  local_78 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  uVar13 = *(uint *)((long)__dest + lVar7 + 0xc);
  local_7c = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  local_50 = pcVar8;
  if ((local_78 != 0 && (local_80 != 0 && uVar10 != 0)) ||
     (((uVar10 == 0 && local_80 == 0) && local_78 == 0) && local_7c == 0)) {
    uVar13 = *(uint *)((long)__dest + lVar7 + 0x10);
    uVar9 = (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                   uVar13 << 0x18);
    lVar7 = lVar7 + 0x14;
    if (uVar14 - lVar7 < uVar9) goto LAB_0010a581;
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    lVar15 = lVar7 + uVar9;
    uVar13 = 0xffffffff;
    bVar17 = true;
    local_60 = uVar9;
    local_58 = lVar7;
    switch(local_48 & 0xffffffff) {
    case 0:
switchD_0010a5fd_caseD_0:
      _buf = (long *)((long)__dest + local_58);
      if ((2 < (uint)local_60) && (*(uchar *)((long)_buf + 2) == 0xff && (short)*_buf == -0x2701)) {
        uVar13 = 1;
        break;
      }
      if (((uint)local_60 < 8) || (*_buf != 0xa1a0a0d474e5089)) {
        iVar5 = op_is_gif((uchar *)_buf,local_60);
        uVar13 = -(uint)(iVar5 == 0) | 3;
      }
      else {
        uVar13 = 2;
        bVar17 = false;
      }
      goto LAB_0010a863;
    case 3:
      local_40 = lVar15;
      iVar5 = strcmp(pcVar16,"-->");
      if (iVar5 != 0) {
        iVar5 = (int)local_48;
        lVar15 = local_40;
        if (iVar5 < 9) {
          if (iVar5 == 0) goto switchD_0010a5fd_caseD_0;
LAB_0010a71e:
          if (iVar5 == 6) goto switchD_0010a5fd_caseD_6;
        }
        else {
          if (iVar5 == 9) goto switchD_0010a5fd_caseD_9;
          if (iVar5 == 10) goto switchD_0010a5fd_caseD_a;
        }
        break;
      }
      if (uVar4 == 1 && (uVar10 != 0 || local_80 != 0)) {
        __ptr = (uchar *)0x0;
        bVar2 = true;
        if ((uVar10 != 0x20) || (local_80 != 0x20)) {
          uVar10 = 0;
          local_80 = 0;
          local_78 = 0;
          local_7c = 0;
          oVar12 = 0;
          uVar13 = 0;
          uVar4 = 0;
          pcVar8 = local_50;
          goto LAB_0010a3c4;
        }
      }
      *(undefined1 *)((long)__dest + local_40) = 0;
      lVar15 = local_40 + 1;
      uVar13 = 0;
      goto LAB_0010a9ac;
    case 6:
switchD_0010a5fd_caseD_6:
      iVar5 = op_strncasecmp(pcVar16,"image/",6);
      if (iVar5 == 0) goto switchD_0010a5fd_caseD_0;
      break;
    case 9:
switchD_0010a5fd_caseD_9:
      iVar5 = op_strncasecmp(pcVar16,"image/png",9);
      if (iVar5 == 0) {
        bVar17 = true;
        if (7 < (uint)local_60) {
          bVar17 = *(long *)((long)__dest + local_58) != 0xa1a0a0d474e5089;
        }
        uVar13 = -(uint)bVar17 | 2;
      }
      else {
        iVar5 = op_strncasecmp(pcVar16,"image/gif",9);
        if (iVar5 != 0) {
          iVar5 = (int)local_48;
          if (iVar5 != 0) goto LAB_0010a71e;
          goto switchD_0010a5fd_caseD_0;
        }
        iVar5 = op_is_gif((uchar *)((long)__dest + local_58),local_60);
        uVar13 = -(uint)(iVar5 == 0) | 3;
      }
      break;
    case 10:
switchD_0010a5fd_caseD_a:
      iVar5 = op_strncasecmp(pcVar16,"image/jpeg",10);
      if (iVar5 == 0) {
        if (2 < (uint)local_60) {
          uVar13 = (uint)(*(char *)((long)__dest + local_58 + 2) == -1 &&
                         *(short *)((long)__dest + local_58) == -0x2701) * 2 - 1;
        }
      }
      else {
        iVar5 = (int)local_48;
        if (iVar5 == 0) goto switchD_0010a5fd_caseD_0;
        if (iVar5 == 6) goto switchD_0010a5fd_caseD_6;
        if (iVar5 == 9) goto switchD_0010a5fd_caseD_9;
      }
    }
LAB_0010a863:
    local_70 = 0;
    local_6c = 0;
    local_68 = 0;
    local_64 = 0;
    local_74 = -1;
    if (uVar13 == 3) {
      op_extract_gif_params
                ((uchar *)((long)__dest + local_58),local_60,&local_64,&local_68,&local_6c,&local_70
                 ,&local_74);
    }
    else if (uVar13 == 2) {
      op_extract_png_params
                ((uchar *)((long)__dest + local_58),local_60,&local_64,&local_68,&local_6c,&local_70
                 ,&local_74);
    }
    else if (uVar13 == 1) {
      op_extract_jpeg_params
                ((uchar *)((long)__dest + local_58),local_60,&local_64,&local_68,&local_6c,&local_70
                 ,&local_74);
    }
    if (-1 < local_74) {
      uVar10 = local_64;
      local_78 = local_6c;
      local_80 = local_68;
      local_7c = local_70;
    }
    if (uVar4 == 1) {
      if ((bVar17 != false || uVar10 != 0x20) || (local_80 != 0x20)) goto LAB_0010a581;
      uVar13 = 2;
      uVar10 = 0x20;
      local_80 = 0x20;
    }
LAB_0010a9ac:
    lVar7 = local_58;
    sVar6 = lVar15 - local_58;
    memmove(__dest,(void *)((long)__dest + local_58),sVar6);
    __ptr = (uchar *)realloc(__dest,sVar6);
    if ((lVar15 == lVar7) || (__ptr != (uchar *)0x0)) {
      bVar2 = false;
      iVar3 = 0;
      oVar12 = (opus_uint32)local_60;
      pcVar8 = local_50;
      goto LAB_0010a3c4;
    }
    iVar3 = -0x81;
  }
LAB_0010a581:
  __ptr = (uchar *)0x0;
  uVar13 = 0;
  local_80 = 0;
  oVar12 = 0;
  bVar2 = true;
  uVar4 = 0;
  local_7c = 0;
  local_78 = 0;
  uVar10 = 0;
  pcVar8 = local_50;
LAB_0010a3c4:
  if (bVar2) {
    free(pcVar8);
    free(pcVar16);
    free(__ptr);
    free(__dest);
  }
  else {
    local_38->type = uVar4;
    *(undefined4 *)&local_38->field_0x4 = 0;
    local_38->mime_type = pcVar16;
    local_38->description = pcVar8;
    local_38->width = uVar10;
    local_38->height = local_80;
    local_38->depth = local_78;
    local_38->colors = local_7c;
    local_38->data_length = oVar12;
    *(undefined4 *)&local_38->field_0x2c = 0;
    local_38->data = __ptr;
    local_38->format = uVar13;
    *(undefined4 *)&local_38->field_0x3c = 0;
  }
  return iVar3;
}

Assistant:

int opus_picture_tag_parse(OpusPictureTag *_pic,const char *_tag){
  OpusPictureTag  pic;
  unsigned char  *buf;
  size_t          base64_sz;
  size_t          buf_sz;
  size_t          tag_length;
  int             ret;
  if(opus_tagncompare("METADATA_BLOCK_PICTURE",22,_tag)==0)_tag+=23;
  /*Figure out how much BASE64-encoded data we have.*/
  tag_length=strlen(_tag);
  if(tag_length&3)return OP_ENOTFORMAT;
  base64_sz=tag_length>>2;
  buf_sz=3*base64_sz;
  if(buf_sz<32)return OP_ENOTFORMAT;
  if(_tag[tag_length-1]=='=')buf_sz--;
  if(_tag[tag_length-2]=='=')buf_sz--;
  if(buf_sz<32)return OP_ENOTFORMAT;
  /*Allocate an extra byte to allow appending a terminating NUL to URL data.*/
  buf=(unsigned char *)_ogg_malloc(sizeof(*buf)*(buf_sz+1));
  if(buf==NULL)return OP_EFAULT;
  opus_picture_tag_init(&pic);
  ret=opus_picture_tag_parse_impl(&pic,_tag,buf,buf_sz,base64_sz);
  if(ret<0){
    opus_picture_tag_clear(&pic);
    _ogg_free(buf);
  }
  else *_pic=*&pic;
  return ret;
}